

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deque.hpp
# Opt level: O2

void __thiscall
ft::deque<int,_ft::allocator<int>_>::dequeInit(deque<int,_ft::allocator<int>_> *this,size_type n)

{
  void *pvVar1;
  size_type sVar2;
  pointer pvVar3;
  map_pointer ppiVar4;
  void *pvVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  size_type i;
  
  uVar7 = n >> 6;
  uVar6 = 5;
  if (5 < uVar7) {
    uVar6 = uVar7;
  }
  this->m_chunks = uVar7 + 1;
  this->m_map_size = uVar6 + 3;
  ppiVar4 = (map_pointer)operator_new(uVar6 * 8 + 0x18);
  this->m_map = ppiVar4;
  uVar6 = this->m_map_size;
  sVar2 = this->m_chunks;
  pvVar1 = (void *)((long)ppiVar4 + (uVar6 - sVar2 & 0xfffffffffffffffe) * 4);
  lVar8 = 0;
  for (uVar7 = 0; ppiVar4 = this->m_map, uVar7 < uVar6; uVar7 = uVar7 + 1) {
    if ((void *)((long)pvVar1 + sVar2 * 8 + -8) < (void *)((long)ppiVar4 + lVar8) ||
        (void *)((long)ppiVar4 + lVar8) < pvVar1) {
      pvVar5 = (void *)0x0;
    }
    else {
      pvVar5 = operator_new(0x100);
      ppiVar4 = this->m_map;
      uVar6 = this->m_map_size;
    }
    *(void **)((long)ppiVar4 + lVar8) = pvVar5;
    lVar8 = lVar8 + 8;
  }
  uVar6 = uVar6 * 4 - 4 & 0xfffffffffffffff8;
  (this->m_start).m_node = (map_pointer)((long)ppiVar4 + uVar6);
  pvVar3 = *(pointer *)((long)ppiVar4 + uVar6);
  (this->m_start).m_first = pvVar3;
  (this->m_start).m_last = pvVar3 + 0x40;
  (this->m_start).m_cur = pvVar3;
  (this->m_finish).m_node = (map_pointer)((long)ppiVar4 + uVar6);
  pvVar3 = *(pointer *)((long)ppiVar4 + uVar6);
  (this->m_finish).m_first = pvVar3;
  (this->m_finish).m_last = pvVar3 + 0x40;
  (this->m_finish).m_cur = pvVar3;
  return;
}

Assistant:

void dequeInit(size_type n) {
		chunk_allocator	chunk_alloc;

		this->m_chunks = (n / this->chunk_size()) + 1;
		this->m_map_size = ft::max<size_type>(8, this->m_chunks + 2);
		this->m_map = chunk_alloc.allocate(this->m_map_size);

		map_pointer	tmp_start = this->m_map + ((this->m_map_size - this->m_chunks) / 2);
		map_pointer	tmp_finish = tmp_start + this->m_chunks - 1;

		for (size_type i = 0; i < this->m_map_size; ++i) {
			pointer p = NULL;
			if (this->m_map + i >= tmp_start && this->m_map + i <= tmp_finish)
				p = this->m_alloc.allocate(this->chunk_size());
			chunk_alloc.construct(this->m_map + i, p);
		}

		this->m_start.setNode(this->m_map + ((this->m_map_size - 1) / 2));
		this->m_start.m_cur = this->m_start.m_first;
		this->m_finish.setNode(this->m_map + ((this->m_map_size - 1) / 2));
		this->m_finish.m_cur = this->m_finish.m_first;
	}